

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractSyntaxTree.cpp
# Opt level: O3

void __thiscall MyCompiler::Term::Term(Term *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  size_type *local_38;
  size_type local_30;
  size_type local_28;
  undefined8 uStack_20;
  
  local_38 = &local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Term","");
  iVar2 = AbstractAstNode::counter + 1;
  (this->super_AbstractAstNode).id = AbstractAstNode::counter;
  AbstractAstNode::counter = iVar2;
  (this->super_AbstractAstNode).caseNum = 0;
  paVar1 = &(this->super_AbstractAstNode).name.field_2;
  (this->super_AbstractAstNode).name._M_dataplus._M_p = (pointer)paVar1;
  if (local_38 == &local_28) {
    paVar1->_M_allocated_capacity = local_28;
    *(undefined8 *)((long)&(this->super_AbstractAstNode).name.field_2 + 8) = uStack_20;
  }
  else {
    (this->super_AbstractAstNode).name._M_dataplus._M_p = (pointer)local_38;
    (this->super_AbstractAstNode).name.field_2._M_allocated_capacity = local_28;
  }
  (this->super_AbstractAstNode).name._M_string_length = local_30;
  (this->super_AbstractAstNode).value._M_dataplus._M_p =
       (pointer)&(this->super_AbstractAstNode).value.field_2;
  (this->super_AbstractAstNode).value._M_string_length = 0;
  (this->super_AbstractAstNode).value.field_2._M_local_buf[0] = '\0';
  (this->pFactor).super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->pFactor).super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->vMulDivOpFactor).
  super__Vector_base<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vMulDivOpFactor).
  super__Vector_base<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vMulDivOpFactor).
  super__Vector_base<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

MyCompiler::Term::Term()
        : AbstractAstNode("Term")
{}